

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall SquareMatrix_Basics3_Test::TestBody(SquareMatrix_Basics3_Test *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int i_1;
  Float (*paFVar5) [3];
  undefined1 (*pauVar6) [16];
  int i;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  AssertHelper *pAVar10;
  int i_4;
  int iVar11;
  internal *piVar12;
  Float (*this_00) [3];
  char *pcVar13;
  char *in_R9;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  AssertionResult gtest_ar_;
  optional<pbrt::SquareMatrix<3>_> inv;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_2;
  SquareMatrix<3> m3;
  undefined1 local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_160;
  undefined4 uStack_150;
  bool bStack_14c;
  undefined1 auStack_148 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_138;
  undefined4 uStack_128;
  bool bStack_124;
  AssertHelper AStack_120;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_118;
  undefined1 auStack_110 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_108;
  Float aFStack_100 [6];
  AssertHelper local_e8;
  undefined1 local_e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_d8;
  Float aFStack_d0 [6];
  AssertHelper local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  AssertHelper local_90;
  SquareMatrix<3> local_88;
  undefined8 local_60;
  anon_struct_4_0_00000001_for___align local_58 [2];
  undefined8 local_50;
  Float local_48 [2];
  uint local_40 [3];
  SquareMatrix<3> local_34;
  
  paFVar5 = (Float (*) [3])&local_34;
  lVar7 = 0;
  do {
    auVar18 = vpbroadcastq_avx512f();
    uVar2 = vpcmpeqq_avx512f(auVar18,_DAT_0060a780);
    uVar3 = vpcmpeqq_avx512f(auVar18,_DAT_0060a7c0);
    lVar7 = lVar7 + 1;
    auVar18 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
    auVar18 = vpsrld_avx512f(auVar18,0x1f);
    auVar18 = vcvtdq2ps_avx512f(auVar18);
    auVar18._12_4_ = paFVar5[1][0];
    auVar18._16_4_ = paFVar5[1][1];
    auVar18._20_4_ = paFVar5[1][2];
    auVar18._24_4_ = paFVar5[2][0];
    auVar18._28_4_ = paFVar5[2][1];
    auVar18._32_4_ = paFVar5[2][2];
    auVar18._36_4_ = ((SquareMatrix<3> *)(paFVar5 + 3))->m[0][0];
    auVar18._40_4_ = ((SquareMatrix<3> *)(paFVar5 + 3))->m[0][1];
    auVar18._44_4_ = ((SquareMatrix<3> *)(paFVar5 + 3))->m[0][2];
    auVar18._48_4_ = paFVar5[4][0];
    auVar18._52_4_ = paFVar5[4][1];
    auVar18._56_4_ = paFVar5[4][2];
    auVar18._60_4_ = paFVar5[5][0];
    *(undefined1 (*) [64])paFVar5 = auVar18;
    paFVar5 = paFVar5 + 1;
  } while (lVar7 != 3);
  bVar4 = pbrt::SquareMatrix<3>::IsIdentity(&local_34);
  local_170[0] = bVar4;
  local_170._8_8_ = (undefined8 *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_148,(internal *)local_170,(AssertionResult *)"m3.IsIdentity()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x191,(char *)auStack_148);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (auStack_148 != (undefined1  [8])&aStack_138) {
      operator_delete((void *)auStack_148,aStack_138._M_allocated_capacity + 1);
    }
    if (local_b8.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_170 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  auStack_148 = (undefined1  [8])0x3f800000;
  sStack_140.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  aStack_138._M_allocated_capacity = 0x3f800000;
  aStack_138._8_8_ = 0;
  uStack_128 = 1.0;
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)local_170,"m3","SquareMatrix<3>(1, 0, 0, 0, 1, 0, 0, 0, 1)",&local_34,
             (SquareMatrix<3> *)auStack_148);
  if ((internal)local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)auStack_148);
    if ((undefined8 *)local_170._8_8_ == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_170._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x193,pcVar13);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)auStack_148);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (auStack_148 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (auStack_148 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)auStack_148 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_170 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  piVar12 = (internal *)local_170;
  auStack_148 = (undefined1  [8])0x3f80000000000000;
  sStack_140.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  aStack_138._M_allocated_capacity = 0x3f800000;
  aStack_138._8_8_ = 0;
  uStack_128 = 1.0;
  testing::internal::CmpHelperNE<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            (piVar12,"m3","SquareMatrix<3>(0, 1, 0, 0, 1, 0, 0, 0, 1)",&local_34,
             (SquareMatrix<3> *)auStack_148);
  if ((internal)local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)auStack_148);
    if ((undefined8 *)local_170._8_8_ == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_170._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x194,pcVar13);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)auStack_148);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (auStack_148 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (auStack_148 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)auStack_148 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_170 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  lVar7 = 0;
  auStack_148 = (undefined1  [8])0x40000000;
  sStack_140.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  aStack_138._M_allocated_capacity = 0xbf800000;
  aStack_138._8_8_ = 0;
  uStack_128 = 3.0;
  do {
    auVar20 = vpbroadcastq_avx512f();
    lVar7 = lVar7 + 1;
    uVar2 = vpcmpeqq_avx512f(auVar20,auVar18);
    uVar3 = vpcmpeqq_avx512f(auVar20,auVar19);
    auVar20 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
    auVar20 = vpsrld_avx512f(auVar20,0x1f);
    auVar20 = vcvtdq2ps_avx512f(auVar20);
    auVar20._12_4_ = *(undefined4 *)(piVar12 + 0xc);
    auVar20._16_4_ = *(undefined4 *)(piVar12 + 0x10);
    auVar20._20_4_ = *(undefined4 *)(piVar12 + 0x14);
    auVar20._24_4_ = *(undefined4 *)(piVar12 + 0x18);
    auVar20._28_4_ = *(undefined4 *)(piVar12 + 0x1c);
    auVar20._32_4_ = *(undefined4 *)(piVar12 + 0x20);
    auVar20._36_4_ = *(undefined4 *)(piVar12 + 0x24);
    auVar20._40_4_ = *(undefined4 *)(piVar12 + 0x28);
    auVar20._44_4_ = *(undefined4 *)(piVar12 + 0x2c);
    auVar20._48_4_ = *(undefined4 *)(piVar12 + 0x30);
    auVar20._52_4_ = *(undefined4 *)(piVar12 + 0x34);
    auVar20._56_4_ = *(undefined4 *)(piVar12 + 0x38);
    auVar20._60_4_ = *(undefined4 *)(piVar12 + 0x3c);
    *(undefined1 (*) [64])piVar12 = auVar20;
    piVar12 = piVar12 + 0xc;
  } while (lVar7 != 3);
  paFVar5 = (Float (*) [3])auStack_148;
  local_170._0_4_ = 2.0;
  aStack_160._M_allocated_capacity._0_4_ = 0xbf800000;
  uStack_150 = 3.0;
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)&local_b8,"SquareMatrix<3>(2, 0, 0, 0, -1, 0, 0, 0, 3)",
             "SquareMatrix<3>::Diag(2, -1, 3)",(SquareMatrix<3> *)paFVar5,
             (SquareMatrix<3> *)local_170);
  if (local_b8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)auStack_148);
    if (sStack_b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar13 = "";
    }
    else {
      pcVar13 = ((sStack_b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x197,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_170,(Message *)auStack_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_170);
    if (auStack_148 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (auStack_148 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)auStack_148 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  this_00 = (Float (*) [3])&local_b8;
  local_b8.data_ = (AssertHelperData *)0x400000003f800000;
  sStack_b0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4080000040400000;
  uStack_a8 = 0x40c0000040a00000;
  uStack_a0 = 0x4100000040e00000;
  local_98 = 0x41100000;
  bVar4 = pbrt::SquareMatrix<3>::IsIdentity((SquareMatrix<3> *)this_00);
  local_170[0] = !bVar4;
  local_170._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar4) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_148,(internal *)local_170,(AssertionResult *)"m.IsIdentity()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x19a,(char *)auStack_148);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_110,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_110);
    if (auStack_148 != (undefined1  [8])&aStack_138) {
      operator_delete((void *)auStack_148,aStack_138._M_allocated_capacity + 1);
    }
    if ((long *)local_88.m[0]._0_8_ != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_88.m[0]._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88.m[0]._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_170 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  lVar7 = 0;
  local_88.m[0][0] = 1.0;
  local_88.m[0][1] = 4.0;
  local_88.m[0][2] = 7.0;
  local_88.m[1][0] = 2.0;
  local_88.m[1][1] = 5.0;
  local_88.m[1][2] = 8.0;
  local_88.m[2][0] = 3.0;
  local_88.m[2][1] = 6.0;
  local_88.m[2][2] = 9.0;
  do {
    auVar20 = vpbroadcastq_avx512f();
    lVar7 = lVar7 + 1;
    uVar2 = vpcmpeqq_avx512f(auVar20,auVar18);
    uVar3 = vpcmpeqq_avx512f(auVar20,auVar19);
    auVar20 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
    auVar20 = vpsrld_avx512f(auVar20,0x1f);
    auVar21 = vcvtdq2ps_avx512f(auVar20);
    auVar20 = *(undefined1 (*) [64])paFVar5;
    auVar21._12_4_ = auVar20._12_4_;
    auVar21._16_4_ = auVar20._16_4_;
    auVar21._20_4_ = auVar20._20_4_;
    auVar21._24_4_ = auVar20._24_4_;
    auVar21._28_4_ = auVar20._28_4_;
    auVar21._32_4_ = auVar20._32_4_;
    auVar21._36_4_ = auVar20._36_4_;
    auVar21._40_4_ = auVar20._40_4_;
    auVar21._44_4_ = auVar20._44_4_;
    auVar21._48_4_ = auVar20._48_4_;
    auVar21._52_4_ = auVar20._52_4_;
    auVar21._56_4_ = auVar20._56_4_;
    auVar21._60_4_ = auVar20._60_4_;
    *(undefined1 (*) [64])paFVar5 = auVar21;
    paFVar5 = paFVar5 + 1;
  } while (lVar7 != 3);
  auVar16 = vpbroadcastq_avx512vl();
  auVar16 = vpaddq_avx2(auVar16,_DAT_0060a520);
  pauVar6 = (undefined1 (*) [16])auStack_148;
  puVar8 = (undefined8 *)0x0;
  do {
    auVar17 = vpbroadcastq_avx512vl();
    puVar8 = (undefined8 *)((long)puVar8 + 1);
    auVar17 = vpsllq_avx2(auVar17,2);
    vpaddq_avx2(auVar16,auVar17);
    auVar15 = vgatherqps_avx512vl(*puVar8);
    auVar15._12_4_ = SUB164(*pauVar6,0xc);
    *pauVar6 = auVar15;
    pauVar6 = (undefined1 (*) [16])(*pauVar6 + 0xc);
  } while (puVar8 != (undefined8 *)0x3);
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)local_170,"Transpose(m)","mt",(SquareMatrix<3> *)auStack_148,&local_88);
  if ((internal)local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)auStack_148);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_170._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x19c,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_110,(Message *)auStack_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_110);
    if (auStack_148 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (auStack_148 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)auStack_148 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_170 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  lVar7 = 0;
  sStack_140.ptr_ = sStack_140.ptr_ & 0xffffffff00000000;
  auStack_148 = (undefined1  [8])0x0;
  local_40[0] = 0x3f800000;
  local_40[1] = 0xc0000000;
  local_40[2] = 0x40800000;
  do {
    auVar15 = ZEXT816(0) << 0x40;
    lVar9 = 0;
    do {
      auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)(*(Float (*) [3])*this_00)[lVar9]),
                                ZEXT416(local_40[lVar9]));
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    *(int *)(auStack_148 + lVar7 * 4) = auVar15._0_4_;
    lVar7 = lVar7 + 1;
    this_00 = this_00 + 1;
  } while (lVar7 != 3);
  local_170._0_4_ = 9;
  local_50 = (pointer)auStack_148;
  local_48[0] = (Float)sStack_140.ptr_._0_4_;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"1 - 4 + 12","vt[0]",(int *)local_170,(float *)&local_50);
  if ((internal)auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)sStack_140.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a0,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_110,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_110);
    if ((AssertHelperData *)local_170._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_170._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_170._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170._0_4_ = 0x12;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"4 - 10 + 24","vt[1]",(int *)local_170,
             (float *)((long)&local_50 + 4));
  if ((internal)auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)sStack_140.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a1,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_110,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_110);
    if ((AssertHelperData *)local_170._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_170._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_170._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170._0_4_ = 0x1b;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"7 - 16 + 36","vt[2]",(int *)local_170,local_48);
  if ((internal)auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)sStack_140.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a2,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_110,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_110);
    if ((AssertHelperData *)local_170._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_170._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_170._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar10 = &local_b8;
  lVar7 = 0;
  local_170._0_8_ = local_170._0_8_ & 0xffffffff00000000;
  auStack_148 = (undefined1  [8])0x0;
  do {
    iVar11 = (int)lVar7;
    piVar12 = (internal *)auStack_148;
    if ((iVar11 != 0) && (piVar12 = (internal *)(auStack_148 + 4), iVar11 != 1)) {
      piVar12 = (internal *)local_170;
    }
    *(int *)piVar12 = 0;
    lVar9 = 0;
    do {
      bVar4 = lVar9 == 1;
      bVar14 = lVar9 == 0;
      piVar12 = (internal *)auStack_148;
      if ((iVar11 != 0) && (piVar12 = (internal *)(auStack_148 + 4), iVar11 != 1)) {
        piVar12 = (internal *)local_170;
      }
      lVar1 = lVar9 * 4;
      lVar9 = lVar9 + 1;
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)bVar14 * 0x3f800000 +
                                        (uint)!bVar14 * *(int *)(&DAT_0060a448 + (ulong)bVar4 * 4)),
                                ZEXT416(*(uint *)((long)&pAVar10->data_ + lVar1)),
                                ZEXT416(*(uint *)piVar12));
      *(int *)piVar12 = auVar15._0_4_;
    } while (lVar9 != 3);
    lVar7 = lVar7 + 1;
    pAVar10 = (AssertHelper *)((long)&pAVar10[1].data_ + 4);
  } while (lVar7 != 3);
  local_58[0] = (anon_struct_4_0_00000001_for___align)local_170._0_4_;
  local_170._0_4_ = 9;
  local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)auStack_148;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"1 - 4 + 12","v3t[0]",(int *)local_170,(float *)&local_60);
  if ((internal)auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)sStack_140.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a6,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_110,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_110);
    if ((AssertHelperData *)local_170._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_170._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_170._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170._0_4_ = 0x12;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"4 - 10 + 24","v3t[1]",(int *)local_170,
             (float *)((long)&local_60 + 4));
  if ((internal)auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)sStack_140.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a7,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_110,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_110);
    if ((AssertHelperData *)local_170._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_170._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_170._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170._0_4_ = 0x1b;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"7 - 16 + 36","v3t[2]",(int *)local_170,(float *)local_58);
  if ((internal)auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)sStack_140.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a8,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_110,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_170._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pbrt::Inverse<3>((optional<pbrt::SquareMatrix<3>_> *)auStack_148,&local_34);
  auStack_110[0] = bStack_124;
  sStack_108.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bStack_124 == false) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)auStack_110,(AssertionResult *)"inv.has_value()",
               "false","true",(char *)piVar12);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1ab,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_120,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._0_8_ != &aStack_160) {
      operator_delete((void *)local_170._0_8_,aStack_160._M_allocated_capacity + 1);
    }
    if (local_e0 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_e0 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_e0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (bStack_124 == false) {
    pbrt::LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
  }
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)local_170,"m3","*inv",&local_34,(SquareMatrix<3> *)auStack_148);
  if ((internal)local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)auStack_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_170._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1ac,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)auStack_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (auStack_110 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (auStack_110 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)auStack_110 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_170 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  auStack_110 = (undefined1  [8])0x40000000;
  sStack_108.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  aFStack_100[0] = 4.0;
  aFStack_100[1] = 0.0;
  aFStack_100[2] = 0.0;
  aFStack_100[3] = 0.0;
  aFStack_100[4] = -1.0;
  pbrt::Inverse<3>((optional<pbrt::SquareMatrix<3>_> *)local_170,(SquareMatrix<3> *)auStack_110);
  if (bStack_124 == true) {
    bStack_124 = false;
  }
  if (bStack_14c == true) {
    uStack_128 = uStack_150;
    local_e0[0] = (internal)0x1;
    sStack_d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    auStack_148 = (undefined1  [8])local_170._0_8_;
    sStack_140.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._8_8_;
    aStack_138._M_allocated_capacity = aStack_160._M_allocated_capacity;
    aStack_138._8_8_ = aStack_160._8_8_;
    bStack_124 = true;
  }
  else {
    local_e0[0] = (internal)bStack_124;
    sStack_d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bStack_124 == false) {
      testing::Message::Message((Message *)&AStack_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_170,(internal *)local_e0,(AssertionResult *)"inv.has_value()",
                 "false","true",(char *)piVar12);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                 ,0x1b0,(char *)local_170._0_8_);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&AStack_120);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ != &aStack_160) {
        operator_delete((void *)local_170._0_8_,aStack_160._M_allocated_capacity + 1);
      }
      if (CONCAT71(AStack_120.data_._1_7_,AStack_120.data_._0_1_) != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           ((long *)CONCAT71(AStack_120.data_._1_7_,AStack_120.data_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(AStack_120.data_._1_7_,AStack_120.data_._0_1_) + 8))();
        }
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x3f000000;
  local_170._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  aStack_160._M_allocated_capacity = 0x3e800000;
  aStack_160._8_4_ = 0.0;
  aStack_160._12_4_ = 0.0;
  uStack_150 = -1.0;
  if (bStack_124 == false) {
    pbrt::LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
  }
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)local_e0,"SquareMatrix<3>(0.5, 0, 0, 0, .25, 0, 0, 0, -1)","*inv",
             (SquareMatrix<3> *)local_170,(SquareMatrix<3> *)auStack_148);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar13 = "";
    }
    else {
      pcVar13 = ((sStack_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1b1,pcVar13);
    testing::internal::AssertHelper::operator=(&AStack_120,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper(&AStack_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_170._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0 = (undefined1  [8])0x0;
  sStack_d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40000000;
  aFStack_d0[0] = 0.0;
  aFStack_d0[1] = 0.0;
  aFStack_d0[2] = 1.0;
  aFStack_d0[3] = 1.0;
  aFStack_d0[4] = 1.0;
  pbrt::Inverse<3>((optional<pbrt::SquareMatrix<3>_> *)local_170,(SquareMatrix<3> *)local_e0);
  if (bStack_124 == true) {
    bStack_124 = false;
  }
  if (bStack_14c == true) {
    AStack_120.data_._0_1_ = (internal)0x0;
    uStack_128 = uStack_150;
    auStack_148 = (undefined1  [8])local_170._0_8_;
    sStack_140.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._8_8_;
    aStack_138._M_allocated_capacity = aStack_160._M_allocated_capacity;
    aStack_138._8_8_ = aStack_160._8_8_;
    bStack_124 = true;
  }
  else {
    AStack_120.data_._0_1_ = (internal)(bStack_124 ^ 1);
    sStack_118.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bStack_124 == false) goto LAB_00326c03;
  }
  sStack_118.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&local_e8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_170,(internal *)&AStack_120,(AssertionResult *)"inv.has_value()","true"
             ,"false",(char *)piVar12);
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
             ,0x1b5,(char *)local_170._0_8_);
  testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_e8);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,aStack_160._M_allocated_capacity + 1);
  }
  if (local_e8.data_ != (AssertHelperData *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && (local_e8.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
LAB_00326c03:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(SquareMatrix, Basics3) {
    SquareMatrix<3> m3;
    EXPECT_TRUE(m3.IsIdentity());

    EXPECT_EQ(m3, SquareMatrix<3>(1, 0, 0, 0, 1, 0, 0, 0, 1));
    EXPECT_NE(m3, SquareMatrix<3>(0, 1, 0, 0, 1, 0, 0, 0, 1));

    EXPECT_EQ(SquareMatrix<3>(2, 0, 0, 0, -1, 0, 0, 0, 3),
              SquareMatrix<3>::Diag(2, -1, 3));

    SquareMatrix<3> m(1, 2, 3, 4, 5, 6, 7, 8, 9);
    EXPECT_FALSE(m.IsIdentity());
    SquareMatrix<3> mt(1, 4, 7, 2, 5, 8, 3, 6, 9);
    EXPECT_EQ(Transpose(m), mt);

    pstd::array<Float, 3> v{1, -2, 4};
    pstd::array<Float, 3> vt = m * v;
    EXPECT_EQ(1 - 4 + 12, vt[0]);
    EXPECT_EQ(4 - 10 + 24, vt[1]);
    EXPECT_EQ(7 - 16 + 36, vt[2]);

    Vector3f v3(1, -2, 4);
    Vector3f v3t = m * v3;
    EXPECT_EQ(1 - 4 + 12, v3t[0]);
    EXPECT_EQ(4 - 10 + 24, v3t[1]);
    EXPECT_EQ(7 - 16 + 36, v3t[2]);

    pstd::optional<SquareMatrix<3>> inv = Inverse(m3);
    EXPECT_TRUE(inv.has_value());
    EXPECT_EQ(m3, *inv);

    SquareMatrix<3> ms(2, 0, 0, 0, 4, 0, 0, 0, -1);
    inv = Inverse(ms);
    EXPECT_TRUE(inv.has_value());
    EXPECT_EQ(SquareMatrix<3>(0.5, 0, 0, 0, .25, 0, 0, 0, -1), *inv);

    SquareMatrix<3> degen(0, 0, 2, 0, 0, 0, 1, 1, 1);
    inv = Inverse(degen);
    EXPECT_FALSE(inv.has_value());
}